

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O1

pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> * __thiscall
QPDF::processXRefIndex
          (pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
           *__return_storage_ptr__,QPDF *this,QPDFObjectHandle *dict,int max_num_entries,
          function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)> *damaged)

{
  _Alloc_hider _Var1;
  bool bVar2;
  uint uVar3;
  longlong __val;
  longlong __val_00;
  long *plVar4;
  QPDFExc *pQVar5;
  size_type *psVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  pointer this_00;
  long lVar8;
  initializer_list<std::pair<int,_int>_> __l;
  QPDFObjectHandle Index_obj;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> indx;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> index_vec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  int local_184;
  _Any_data *local_180;
  int local_174;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> *local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  QPDFObjectHandle local_108;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_f8;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_d8;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  paVar7 = &local_1a8.field_2;
  local_1a8._M_dataplus._M_p = (pointer)paVar7;
  local_174 = max_num_entries;
  local_150 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"/Size","");
  QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_170,(string *)dict);
  uVar3 = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)&local_170);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar7) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  local_1a8._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"/Index","");
  QPDFObjectHandle::getKey(&local_108,(string *)dict);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar7) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  bVar2 = QPDFObjectHandle::isArray(&local_108);
  if (bVar2) {
    local_f8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    QPDFObjectHandle::getArrayAsVector(&local_d8,&local_108);
    if (((ulong)((long)local_d8.
                       super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)local_d8.
                      super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                      _M_impl.super__Vector_impl_data._M_start) < 0x11) ||
       (((long)local_d8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)local_d8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
               _M_impl.super__Vector_impl_data._M_start & 0x10U) != 0)) {
      pQVar5 = (QPDFExc *)__cxa_allocate_exception(0x80);
      local_1a8._M_dataplus._M_p = (pointer)0x3f;
      local_1a8._M_string_length = 0x283e56;
      if ((damaged->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*damaged->_M_invoker)
                (pQVar5,(_Any_data *)damaged,
                 (basic_string_view<char,_std::char_traits<char>_> *)&local_1a8);
      __cxa_throw(pQVar5,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    if (local_d8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_d8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_184 = 0;
    }
    else {
      lVar8 = (long)local_174;
      uVar3 = 0;
      __val = 0;
      local_184 = 0;
      this_00 = local_d8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_180 = (_Any_data *)damaged;
      do {
        bVar2 = QPDFObjectHandle::isInteger(this_00);
        if (!bVar2) {
          pQVar5 = (QPDFExc *)__cxa_allocate_exception(0x80);
          std::__cxx11::to_string(&local_128,uVar3);
          std::operator+(&local_170,"Cross-reference stream\'s /Index\'s item ",&local_128);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_170);
          local_1a8._M_dataplus._M_p = (pointer)*plVar4;
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p == paVar7) {
            local_1a8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_1a8.field_2._8_4_ = (undefined4)plVar4[3];
            local_1a8.field_2._12_4_ = *(undefined4 *)((long)plVar4 + 0x1c);
            local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          }
          else {
            local_1a8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
          }
          local_1a8._M_string_length = plVar4[1];
          *plVar4 = (long)paVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          local_148._M_string_length = (size_type)local_1a8._M_dataplus._M_p;
          local_148._M_dataplus._M_p = (pointer)local_1a8._M_string_length;
          if (*(long *)(local_180 + 1) == 0) {
            std::__throw_bad_function_call();
          }
          (**(code **)(local_180->_M_pod_data + 0x18))
                    (pQVar5,local_180,(basic_string_view<char,_std::char_traits<char>_> *)&local_148
                    );
          __cxa_throw(pQVar5,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
        }
        if ((uVar3 & 1) == 0) {
          __val = QPDFObjectHandle::getIntValue(this_00);
          if (__val < 0) {
            pQVar5 = (QPDFExc *)__cxa_allocate_exception(0x80);
            local_1a8._M_dataplus._M_p = (pointer)0x3d;
            local_1a8._M_string_length = 0x283f04;
            if (*(long *)(local_180 + 1) == 0) {
              std::__throw_bad_function_call();
            }
            (**(code **)(local_180->_M_pod_data + 0x18))
                      (pQVar5,local_180,
                       (basic_string_view<char,_std::char_traits<char>_> *)&local_1a8);
LAB_0022f300:
            __cxa_throw(pQVar5,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
          }
          if (lVar8 < __val) {
            pQVar5 = (QPDFExc *)__cxa_allocate_exception(0x80);
            local_1a8._M_dataplus._M_p = (pointer)0x46;
            local_1a8._M_string_length = 0x283f42;
            if (*(long *)(local_180 + 1) == 0) {
              std::__throw_bad_function_call();
            }
            (**(code **)(local_180->_M_pod_data + 0x18))
                      (pQVar5,local_180,
                       (basic_string_view<char,_std::char_traits<char>_> *)&local_1a8);
            goto LAB_0022f300;
          }
        }
        else {
          __val_00 = QPDFObjectHandle::getIntValue(this_00);
          if (__val_00 < 1) {
            pQVar5 = (QPDFExc *)__cxa_allocate_exception(0x80);
            std::__cxx11::to_string(&local_128,__val_00);
            std::operator+(&local_170,"Cross-reference stream section claims to contain ",&local_128
                          );
            plVar4 = (long *)std::__cxx11::string::append((char *)&local_170);
            local_1a8._M_dataplus._M_p = (pointer)*plVar4;
            paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p == paVar7) {
              local_1a8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
              local_1a8.field_2._8_4_ = (undefined4)plVar4[3];
              local_1a8.field_2._12_4_ = *(undefined4 *)((long)plVar4 + 0x1c);
              local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
            }
            else {
              local_1a8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
            }
            local_1a8._M_string_length = plVar4[1];
            *plVar4 = (long)paVar7;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            local_148._M_string_length = (size_type)local_1a8._M_dataplus._M_p;
            local_148._M_dataplus._M_p = (pointer)local_1a8._M_string_length;
            if (*(long *)(local_180 + 1) == 0) {
              std::__throw_bad_function_call();
            }
            (**(code **)(local_180->_M_pod_data + 0x18))
                      (pQVar5,local_180,
                       (basic_string_view<char,_std::char_traits<char>_> *)&local_148);
            __cxa_throw(pQVar5,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
          }
          if ((lVar8 - __val_00 < __val) || (local_174 - local_184 < __val_00)) {
            pQVar5 = (QPDFExc *)__cxa_allocate_exception(0x80);
            std::__cxx11::to_string(&local_70,__val);
            std::operator+(&local_50,"Cross-reference stream claims to contain too many entries: ",
                           &local_70);
            plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
            local_148._M_dataplus._M_p = (pointer)*plVar4;
            psVar6 = (size_type *)(plVar4 + 2);
            if ((size_type *)local_148._M_dataplus._M_p == psVar6) {
              local_148.field_2._M_allocated_capacity = *psVar6;
              local_148.field_2._8_8_ = plVar4[3];
              local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            }
            else {
              local_148.field_2._M_allocated_capacity = *psVar6;
            }
            local_148._M_string_length = plVar4[1];
            *plVar4 = (long)psVar6;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            std::__cxx11::to_string(&local_90,local_174);
            std::operator+(&local_128,&local_148,&local_90);
            plVar4 = (long *)std::__cxx11::string::append((char *)&local_128);
            local_170._M_dataplus._M_p = (pointer)*plVar4;
            psVar6 = (size_type *)(plVar4 + 2);
            if ((size_type *)local_170._M_dataplus._M_p == psVar6) {
              local_170.field_2._M_allocated_capacity = *psVar6;
              local_170.field_2._8_8_ = plVar4[3];
              local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
            }
            else {
              local_170.field_2._M_allocated_capacity = *psVar6;
            }
            local_170._M_string_length = plVar4[1];
            *plVar4 = (long)psVar6;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            std::__cxx11::to_string(&local_b0,local_184);
            std::operator+(&local_1a8,&local_170,&local_b0);
            local_c0._M_len = local_1a8._M_string_length;
            local_c0._M_str = local_1a8._M_dataplus._M_p;
            if (*(long *)(local_180 + 1) == 0) {
              std::__throw_bad_function_call();
            }
            (**(code **)(local_180->_M_pod_data + 0x18))(pQVar5,local_180,&local_c0);
            __cxa_throw(pQVar5,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
          }
          local_1a8._M_dataplus._M_p._0_4_ = (int)__val;
          local_170._M_dataplus._M_p._0_4_ = (int)__val_00;
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_f8,
                     (int *)&local_1a8,(int *)&local_170);
          local_184 = local_184 + (int)__val_00;
        }
        uVar3 = uVar3 + 1;
        this_00 = this_00 + 1;
      } while (this_00 !=
               local_d8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    local_150->first = local_184;
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              (&local_150->second,&local_f8);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_d8);
    _Var1._M_p = (pointer)local_f8.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
    local_1a8.field_2._M_allocated_capacity =
         (size_type)
         local_f8.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    bVar2 = QPDFObjectHandle::isNull(&local_108);
    if (!bVar2) {
      pQVar5 = (QPDFExc *)__cxa_allocate_exception(0x80);
      local_1a8._M_dataplus._M_p = (pointer)0x38;
      local_1a8._M_string_length = 0x283fb1;
      if ((damaged->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*damaged->_M_invoker)
                (pQVar5,(_Any_data *)damaged,
                 (basic_string_view<char,_std::char_traits<char>_> *)&local_1a8);
      __cxa_throw(pQVar5,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    local_170._M_dataplus._M_p = (pointer)((ulong)uVar3 << 0x20);
    __l._M_len = 1;
    __l._M_array = (iterator)&local_170;
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_1a8,__l,
               (allocator_type *)&local_128);
    local_150->first = uVar3;
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              (&local_150->second,
               (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_1a8);
    _Var1._M_p = local_1a8._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var1._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(_Var1._M_p,local_1a8.field_2._M_allocated_capacity - (long)_Var1._M_p);
  }
  if (local_108.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return local_150;
}

Assistant:

std::pair<int, std::vector<std::pair<int, int>>>
QPDF::processXRefIndex(
    QPDFObjectHandle& dict, int max_num_entries, std::function<QPDFExc(std::string_view)> damaged)
{
    auto size = dict.getKey("/Size").getIntValueAsInt();
    auto Index_obj = dict.getKey("/Index");

    if (Index_obj.isArray()) {
        std::vector<std::pair<int, int>> indx;
        int num_entries = 0;
        auto index_vec = Index_obj.getArrayAsVector();
        if ((index_vec.size() % 2) || index_vec.size() < 2) {
            throw damaged("Cross-reference stream's /Index has an invalid number of values");
        }

        int i = 0;
        long long first = 0;
        for (auto& val: index_vec) {
            if (val.isInteger()) {
                if (i % 2) {
                    auto count = val.getIntValue();
                    if (count <= 0) {
                        throw damaged(
                            "Cross-reference stream section claims to contain " +
                            std::to_string(count) + " entries");
                    }
                    // We are guarding against the possibility of num_entries * entry_size
                    // overflowing. We are not checking that entries are in ascending order as
                    // required by the spec, which probably should generate a warning. We are also
                    // not checking that for each subsection first object number + number of entries
                    // <= /Size. The spec requires us to ignore object number > /Size.
                    if (first > (max_num_entries - count) ||
                        count > (max_num_entries - num_entries)) {
                        throw damaged(
                            "Cross-reference stream claims to contain too many entries: " +
                            std::to_string(first) + " " + std::to_string(max_num_entries) + " " +
                            std::to_string(num_entries));
                    }
                    indx.emplace_back(static_cast<int>(first), static_cast<int>(count));
                    num_entries += static_cast<int>(count);
                } else {
                    first = val.getIntValue();
                    if (first < 0) {
                        throw damaged(
                            "Cross-reference stream's /Index contains a negative object id");
                    } else if (first > max_num_entries) {
                        throw damaged(
                            "Cross-reference stream's /Index contains an impossibly "
                            "large object id");
                    }
                }
            } else {
                throw damaged(
                    "Cross-reference stream's /Index's item " + std::to_string(i) +
                    " is not an integer");
            }
            i++;
        }
        QTC::TC("qpdf", "QPDF xref /Index is array", index_vec.size() == 2 ? 0 : 1);
        return {num_entries, indx};
    } else if (Index_obj.isNull()) {
        QTC::TC("qpdf", "QPDF xref /Index is null");
        return {size, {{0, size}}};
    } else {
        throw damaged("Cross-reference stream does not have a proper /Index key");
    }
}